

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O3

void __thiscall
QList<QList<bool_(*)(void_**)>_>::resize(QList<QList<bool_(*)(void_**)>_> *this,qsizetype size)

{
  Data *pDVar1;
  QList<bool_(*)(void_**)> *pQVar2;
  long lVar3;
  
  pDVar1 = (this->d).d;
  if (((pDVar1 == (Data *)0x0) ||
      (1 < (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) ||
     (pQVar2 = (this->d).ptr,
     ((long)((long)pQVar2 -
            ((ulong)((long)&pDVar1[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 3) *
     0x5555555555555555 + (pDVar1->super_QArrayData).alloc < size)) {
    QArrayDataPointer<QList<bool_(*)(void_**)>_>::detachAndGrow
              (&this->d,GrowsAtEnd,size - (this->d).size,(QList<bool_(*)(void_**)> **)0x0,
               (QArrayDataPointer<QList<bool_(*)(void_**)>_> *)0x0);
    lVar3 = (this->d).size;
  }
  else {
    lVar3 = (this->d).size;
    if (size < lVar3) {
      std::_Destroy_aux<false>::__destroy<QList<bool(*)(void**)>*>(pQVar2 + size,pQVar2 + lVar3);
      goto LAB_001f9928;
    }
  }
  if (size - lVar3 == 0 || size < lVar3) {
    return;
  }
  memset((this->d).ptr + lVar3,0,(((size - lVar3) * 0x18 - 0x18U) / 0x18) * 0x18 + 0x18);
LAB_001f9928:
  (this->d).size = size;
  return;
}

Assistant:

void resize(qsizetype size)
    {
        resize_internal(size);
        if (size > this->size())
            d->appendInitialize(size);
    }